

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void BM_Comb_filter(State *state)

{
  bool bVar1;
  array<float,_128UL> output;
  array<float,_512UL> input;
  value_type local_a18 [128];
  undefined1 local_818 [2048];
  
  local_a18[0] = 1.0;
  re::std::array<float,_512UL>::fill((array<float,_512UL> *)local_818,local_a18);
  while( true ) {
    bVar1 = benchmark::State::KeepRunning(state);
    if (!bVar1) break;
    re::math::comb_filter<float,512l,128l>
              ((span<const_float,_512L>)local_818,(span<float,_128L>)local_a18);
  }
  return;
}

Assistant:

static void BM_Comb_filter(benchmark::State& state) {
    std::array<float, 512> input;
    std::array<float, 128> output;
    input.fill(1);
    while (state.KeepRunning()) {
        re::math::comb_filter(
            gsl::span<float const, 512>{input},
            gsl::span<float, 128>{output}
        );
    }
}